

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

string * jsoncons::uri::merge_paths_abi_cxx11_(uri *base,uri *relative)

{
  bool bVar1;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  size_type last_slash;
  string_view *base_path;
  string result;
  uri *in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffeb8;
  size_type in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed0;
  string *this;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string_view local_f0;
  string *local_e0;
  string *input;
  string_view local_d0;
  allocator<char> local_b9;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string local_a8 [32];
  size_type local_88;
  string_view local_80;
  string_view *local_70;
  string_view local_58;
  string_view local_48;
  string local_38 [56];
  
  this = in_RDI;
  input = local_e0;
  std::__cxx11::string::string(local_38);
  local_48 = encoded_authority(in_stack_fffffffffffffeb0);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_48);
  uVar4 = false;
  if (!bVar1) {
    local_58 = encoded_path(in_stack_fffffffffffffeb0);
    uVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_58);
  }
  if ((bool)uVar4 == false) {
    local_80 = encoded_path(in_stack_fffffffffffffeb0);
    local_70 = &local_80;
    local_88 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                         (in_stack_fffffffffffffec8,(char)(in_stack_fffffffffffffec0 >> 0x38),
                          in_stack_fffffffffffffeb8);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8,
                       in_stack_fffffffffffffec0);
    local_b8 = bVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffef0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar4,in_stack_fffffffffffffee8),(allocator<char> *)this);
    std::__cxx11::string::append(local_38);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_b9);
  }
  else {
    std::__cxx11::string::operator=(local_38,"/");
    bVar2._M_str = (char *)in_stack_fffffffffffffec8;
    bVar2._M_len = (size_t)in_stack_fffffffffffffed0;
  }
  local_d0 = encoded_path(in_stack_fffffffffffffeb0);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_d0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    sVar3 = encoded_path(in_stack_fffffffffffffeb0);
    input = (string *)sVar3._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::begin
              ((basic_string_view<char,_std::char_traits<char>_> *)&local_e0);
    local_f0 = encoded_path(in_stack_fffffffffffffeb0);
    std::basic_string_view<char,_std::char_traits<char>_>::end(&local_f0);
    std::__cxx11::string::append<char_const*,void>(this,(char *)in_RDI,(char *)bVar2._M_len);
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffef0,local_38);
  remove_dot_segments(input);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

static std::string merge_paths(const uri& base, const uri& relative)
        {
            std::string result;
            
            if (!base.encoded_authority().empty() && base.encoded_path().empty()) 
            {
                result = "/";
                //result.append(relative.encoded_path().data(), relative.encoded_path().length());
            } 
            else 
            {
                const auto& base_path = base.encoded_path();
                auto last_slash = base_path.rfind('/');
                result.append(std::string(base_path.substr(0,last_slash+1)));
            }
            if (!relative.encoded_path().empty()) 
            {
                result.append(relative.encoded_path().begin(), relative.encoded_path().end());
            }
            return remove_dot_segments(std::move(result));
        }